

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O1

mpc_val_t * mpcf_strfold(int n,mpc_val_t **xs)

{
  size_t sVar1;
  void *pvVar2;
  ulong uVar3;
  long lVar4;
  
  if (n != 0) {
    if (n < 1) {
      sVar1 = 1;
    }
    else {
      uVar3 = 0;
      lVar4 = 0;
      do {
        sVar1 = strlen((char *)xs[uVar3]);
        lVar4 = lVar4 + sVar1;
        uVar3 = uVar3 + 1;
      } while ((uint)n != uVar3);
      sVar1 = lVar4 + 1;
    }
    pvVar2 = realloc(*xs,sVar1);
    *xs = pvVar2;
    if (1 < n) {
      uVar3 = 1;
      do {
        strcat((char *)*xs,(char *)xs[uVar3]);
        free(xs[uVar3]);
        uVar3 = uVar3 + 1;
      } while ((uint)n != uVar3);
    }
    return *xs;
  }
  pvVar2 = calloc(1,1);
  return pvVar2;
}

Assistant:

mpc_val_t *mpcf_strfold(int n, mpc_val_t **xs) {
  int i;
  size_t l = 0;

  if (n == 0) { return calloc(1, 1); }

  for (i = 0; i < n; i++) { l += strlen(xs[i]); }

  xs[0] = realloc(xs[0], l + 1);

  for (i = 1; i < n; i++) {
    strcat(xs[0], xs[i]); free(xs[i]);
  }

  return xs[0];
}